

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_pad2.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105128) = 0;
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x180);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    int k = -9384;

    cout << -k % 1000 << endl;
}